

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O1

Frag __thiscall duckdb_re2::Compiler::Plus(Compiler *this,Frag a,bool nongreedy)

{
  Frag FVar1;
  uint uVar2;
  uint uVar3;
  Inst *pIVar4;
  uint32_t local_50;
  uint uStack_48;
  uint uStack_44;
  uint32_t local_40;
  uint uStack_3c;
  bool bStack_34;
  
  uVar2 = AllocInst(this,1);
  if ((int)uVar2 < 0) {
    local_50 = 0;
    uStack_48 = 0;
    uStack_44 = (uint)uStack_44._1_3_ << 8;
  }
  else {
    pIVar4 = (this->inst_).ptr_._M_t.
             super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
             .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl + uVar2;
    local_40 = a.begin;
    uStack_48 = uVar2 * 2;
    if (nongreedy) {
      Prog::Inst::InitAlt(pIVar4,0,local_40);
    }
    else {
      Prog::Inst::InitAlt(pIVar4,local_40,0);
      uStack_48 = uStack_48 | 1;
    }
    uStack_3c = a.end.head;
    if (uStack_3c != 0) {
      pIVar4 = (this->inst_).ptr_._M_t.
               super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
               .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl;
      do {
        uVar3 = uStack_3c >> 1;
        if ((uStack_3c & 1) == 0) {
          uStack_3c = pIVar4[uVar3].out_opcode_ >> 4;
          pIVar4[uVar3].out_opcode_ = pIVar4[uVar3].out_opcode_ & 0xf | uVar2 << 4;
        }
        else {
          uStack_3c = pIVar4[uVar3].field_1.out1_;
          pIVar4[uVar3].field_1.cap_ = uVar2;
        }
      } while (uStack_3c != 0);
    }
    bStack_34 = a.nullable;
    local_50 = local_40;
    uStack_44 = CONCAT31(uStack_44._1_3_,bStack_34) & 0xffffff01;
  }
  FVar1.end.head = uStack_48;
  FVar1.begin = local_50;
  FVar1.end.tail = uStack_48;
  FVar1._12_4_ = uStack_44;
  return FVar1;
}

Assistant:

Frag Compiler::Plus(Frag a, bool nongreedy) {
  int id = AllocInst(1);
  if (id < 0)
    return NoMatch();
  PatchList pl;
  if (nongreedy) {
    inst_[id].InitAlt(0, a.begin);
    pl = PatchList::Mk(id << 1);
  } else {
    inst_[id].InitAlt(a.begin, 0);
    pl = PatchList::Mk((id << 1) | 1);
  }
  PatchList::Patch(inst_.data(), a.end, id);
  return Frag(a.begin, pl, a.nullable);
}